

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O2

void setnodevector(lua_State *L,Table *t,int size)

{
  int iVar1;
  Node *pNVar2;
  ulong uVar3;
  long lVar4;
  
  if (size == 0) {
    pNVar2 = &dummynode_;
    t->node = &dummynode_;
    iVar1 = 0;
    uVar3 = 0;
  }
  else {
    iVar1 = luaO_ceillog2(size);
    if (0x1e < iVar1) {
      luaG_runerror(L,"table overflow");
    }
    uVar3 = (ulong)(uint)(1 << ((byte)iVar1 & 0x1f));
    pNVar2 = (Node *)luaM_realloc_(L,(void *)0x0,0,0x28L << ((byte)iVar1 & 0x3f));
    t->node = pNVar2;
    for (lVar4 = 0; uVar3 * 0x28 - lVar4 != 0; lVar4 = lVar4 + 0x28) {
      pNVar2 = t->node;
      *(undefined8 *)((long)&pNVar2->i_key + lVar4 + 0x10) = 0;
      *(undefined4 *)((long)&pNVar2->i_key + lVar4 + 8) = 0;
      *(undefined4 *)((long)&(pNVar2->i_val).tt_ + lVar4) = 0;
    }
    pNVar2 = t->node;
  }
  t->lsizenode = (lu_byte)iVar1;
  t->lastfree = pNVar2 + uVar3;
  return;
}

Assistant:

static void setnodevector (lua_State *L, Table *t, int size) {
  int lsize;
  if (size == 0) {  /* no elements to hash part? */
    t->node = cast(Node *, dummynode);  /* use common `dummynode' */
    lsize = 0;
  }
  else {
    int i;
    lsize = luaO_ceillog2(size);
    if (lsize > MAXBITS)
      luaG_runerror(L, "table overflow");
    size = twoto(lsize);
    t->node = luaM_newvector(L, size, Node);
    for (i=0; i<size; i++) {
      Node *n = gnode(t, i);
      gnext(n) = NULL;
      setnilvalue(gkey(n));
      setnilvalue(gval(n));
    }
  }
  t->lsizenode = cast_byte(lsize);
  t->lastfree = gnode(t, size);  /* all positions are free */
}